

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O2

bool __thiscall llvm::Twine::isValid(Twine *this)

{
  NodeKind NVar1;
  NodeKind NVar2;
  
  NVar1 = this->LHSKind;
  NVar2 = this->RHSKind;
  if ((NVar2 != EmptyKind && NVar1 < TwineKind) || (NVar2 == NullKind)) {
    return false;
  }
  if (NVar2 == EmptyKind) {
    if (NVar1 != TwineKind) {
      return true;
    }
  }
  else {
    if (NVar1 == EmptyKind) {
      return false;
    }
    if (NVar1 != TwineKind) goto LAB_0012594f;
  }
  if (((this->LHS).twine)->LHSKind == NullKind) {
    return false;
  }
  if (((this->LHS).twine)->RHSKind == EmptyKind) {
    return false;
  }
LAB_0012594f:
  if (NVar2 == TwineKind) {
    if (((this->RHS).twine)->LHSKind == NullKind) {
      return false;
    }
    if (((this->RHS).twine)->RHSKind == EmptyKind) {
      return false;
    }
  }
  return true;
}

Assistant:

NodeKind getLHSKind() const { return LHSKind; }